

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O1

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinSCAN_X,void>::
eval_exc_inc_<double&,int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinSCAN_X,void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  double rho;
  uint N;
  const_host_buffer_type rho_00;
  const_host_buffer_type sigma;
  const_host_buffer_type tau;
  host_buffer_type eps;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double tau_00;
  double dStack_40;
  double dStack_38;
  
  dVar2 = *args;
  N = *args_1;
  rho_00 = *args_2;
  sigma = *args_3;
  tau = *args_5;
  eps = *args_6;
  if (*(int *)(this + 8) != 0) {
    if (0 < (int)N) {
      uVar1 = 0;
      dStack_38 = dVar2;
      do {
        rho = rho_00[uVar1];
        if (rho <= 1e-15) {
          dStack_40 = 0.0;
        }
        else {
          dVar2 = sigma[uVar1];
          dVar3 = 1.0000000000000052e-40;
          if (1.0000000000000052e-40 <= dVar2) {
            dVar3 = dVar2;
          }
          dVar2 = tau[uVar1];
          tau_00 = 1e-20;
          if (1e-20 <= dVar2) {
            tau_00 = dVar2;
          }
          dVar2 = rho * 8.0 * tau_00;
          if (dVar3 <= dVar2) {
            dVar2 = dVar3;
          }
          kernel_traits<ExchCXX::BuiltinSCAN_X>::eval_exc_unpolar_impl
                    (rho,dVar2,0.0,tau_00,&dStack_40);
          dVar2 = dStack_38;
        }
        eps[uVar1] = dStack_40 * dVar2 + eps[uVar1];
        uVar1 = uVar1 + 1;
      } while (N != uVar1);
    }
    return;
  }
  host_eval_exc_inc_helper_polar<ExchCXX::BuiltinSCAN_X>(dVar2,N,rho_00,sigma,*args_4,tau,eps);
  return;
}

Assistant:

void eval_exc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }